

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O0

spv_target_env glslang::MapToSpirvToolsEnv(SpvVersion *spvVersion,SpvBuildLogger *logger)

{
  int iVar1;
  uint uVar2;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  SpvBuildLogger *local_20;
  SpvBuildLogger *logger_local;
  SpvVersion *spvVersion_local;
  
  iVar1 = spvVersion->vulkan;
  if (iVar1 == 0x400000) {
    spvVersion_local._4_4_ = SPV_ENV_VULKAN_1_0;
  }
  else {
    local_20 = logger;
    logger_local = (SpvBuildLogger *)spvVersion;
    if (iVar1 == 0x401000) {
      uVar2 = spvVersion->spv;
      if ((((uVar2 == 0x10000) || (uVar2 == 0x10100)) || (uVar2 == 0x10200)) || (uVar2 == 0x10300))
      {
        spvVersion_local._4_4_ = SPV_ENV_VULKAN_1_1;
      }
      else if (uVar2 == 0x10400) {
        spvVersion_local._4_4_ = SPV_ENV_VULKAN_1_1_SPIRV_1_4;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Target version for SPIRV-Tools validator",&local_41);
        spv::SpvBuildLogger::missingFunctionality(logger,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator(&local_41);
        spvVersion_local._4_4_ = SPV_ENV_VULKAN_1_1;
      }
    }
    else if (iVar1 == 0x402000) {
      spvVersion_local._4_4_ = SPV_ENV_VULKAN_1_2;
    }
    else if (iVar1 == 0x403000) {
      spvVersion_local._4_4_ = SPV_ENV_VULKAN_1_3;
    }
    else if (iVar1 == 0x404000) {
      spvVersion_local._4_4_ = SPV_ENV_VULKAN_1_4;
    }
    else if (spvVersion->openGl < 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Target version for SPIRV-Tools validator",&local_69);
      spv::SpvBuildLogger::missingFunctionality(logger,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      spvVersion_local._4_4_ = SPV_ENV_UNIVERSAL_1_0;
    }
    else {
      spvVersion_local._4_4_ = SPV_ENV_OPENGL_4_5;
    }
  }
  return spvVersion_local._4_4_;
}

Assistant:

spv_target_env MapToSpirvToolsEnv(const SpvVersion& spvVersion, spv::SpvBuildLogger* logger)
{
    switch (spvVersion.vulkan) {
    case glslang::EShTargetVulkan_1_0:
        return spv_target_env::SPV_ENV_VULKAN_1_0;
    case glslang::EShTargetVulkan_1_1:
        switch (spvVersion.spv) {
        case EShTargetSpv_1_0:
        case EShTargetSpv_1_1:
        case EShTargetSpv_1_2:
        case EShTargetSpv_1_3:
            return spv_target_env::SPV_ENV_VULKAN_1_1;
        case EShTargetSpv_1_4:
            return spv_target_env::SPV_ENV_VULKAN_1_1_SPIRV_1_4;
        default:
            logger->missingFunctionality("Target version for SPIRV-Tools validator");
            return spv_target_env::SPV_ENV_VULKAN_1_1;
        }
    case glslang::EShTargetVulkan_1_2:
        return spv_target_env::SPV_ENV_VULKAN_1_2;
    case glslang::EShTargetVulkan_1_3:
        return spv_target_env::SPV_ENV_VULKAN_1_3;
    case glslang::EShTargetVulkan_1_4:
        return spv_target_env::SPV_ENV_VULKAN_1_4;
    default:
        break;
    }

    if (spvVersion.openGl > 0)
        return spv_target_env::SPV_ENV_OPENGL_4_5;

    logger->missingFunctionality("Target version for SPIRV-Tools validator");
    return spv_target_env::SPV_ENV_UNIVERSAL_1_0;
}